

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_sf2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  SFModulatorItem modulator;
  int *args_1;
  initializer_list<sf2cute::SFGeneratorItem> __l;
  initializer_list<sf2cute::SFInstrumentZone> __l_00;
  initializer_list<sf2cute::SFPresetZone> __l_01;
  allocator_type local_529;
  undefined8 local_528;
  undefined8 local_520;
  undefined1 local_514 [8];
  SFGeneratorItem local_50c;
  vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> local_508;
  shared_ptr<sf2cute::SFPreset> preset_50;
  shared_ptr<sf2cute::SFInstrument> instrument_50;
  shared_ptr<sf2cute::SFSample> sample_50;
  weak_ptr<sf2cute::SFSample> local_4c0;
  __weak_ptr<sf2cute::SFInstrument,(__gnu_cxx::_Lock_policy)2> local_4b0 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  pointer local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_498;
  _Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> local_488;
  vector<short,_std::allocator<short>_> data_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  SFInstrumentZone instrument_zone;
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  ofstream ofs;
  SoundFont sf2;
  
  sf2cute::SoundFont::SoundFont(&sf2);
  std::__cxx11::string::string<std::allocator<char>>(local_3a8,"EMU8000",(allocator<char> *)&ofs);
  std::__cxx11::string::operator=((string *)&sf2.sound_engine_,local_3a8);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::string<std::allocator<char>>(local_3c8,"Chipsound",(allocator<char> *)&ofs);
  std::__cxx11::string::operator=((string *)&sf2.bank_name_,local_3c8);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"ROM",(allocator<char> *)&ofs);
  std::__cxx11::string::operator=((string *)&sf2.rom_name_,local_3e8);
  std::__cxx11::string::~string(local_3e8);
  MakePulseVector(&data_50,4);
  _ofs = 0;
  instrument_zone.super_SFZone._vptr_SFZone._0_4_ =
       (undefined4)
       ((ulong)((long)data_50.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)data_50.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 1);
  local_508.
  super__Vector_base<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xac44;
  instrument_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       0x39;
  preset_50.super___shared_ptr<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  sf2cute::SoundFont::
  NewSample<char_const(&)[7],std::vector<short,std::allocator<short>>&,int,unsigned_int,int,int,int>
            ((SoundFont *)&sample_50,(char (*) [7])&sf2,
             (vector<short,_std::allocator<short>_> *)"Square",(int *)&data_50,(uint *)&ofs,
             (int *)&instrument_zone,(int *)&local_508,(int *)&instrument_50);
  std::__weak_ptr<sf2cute::SFSample,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<sf2cute::SFSample,void>
            ((__weak_ptr<sf2cute::SFSample,(__gnu_cxx::_Lock_policy)2> *)&local_4c0,
             &sample_50.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>);
  sf2cute::SFGeneratorItem::SFGeneratorItem((SFGeneratorItem *)&ofs,kSampleModes,(GenAmountType)0x1)
  ;
  __l._M_len = 1;
  __l._M_array = (iterator)&ofs;
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::vector
            ((vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)
             &local_488,__l,(allocator_type *)&local_508);
  local_458._M_allocated_capacity = 0;
  local_458._8_8_ = 0;
  local_448._M_allocated_capacity = 0;
  sf2cute::SFInstrumentZone::SFInstrumentZone
            (&instrument_zone,&local_4c0,
             (vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)
             &local_488,
             (vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *)
             &local_458);
  std::_Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>::
  ~_Vector_base((_Vector_base<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *
                )&local_458);
  std::_Vector_base<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::
  ~_Vector_base(&local_488);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_4c0.super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  sf2cute::SFGeneratorItem::SFGeneratorItem(&local_50c,kReverbEffectsSend,(GenAmountType)0x26a);
  sf2cute::SFZone::SetGenerator(&instrument_zone.super_SFZone,local_50c);
  sf2cute::SFModulator::SFModulator
            ((SFModulator *)&local_520,kNoteOnVelocity,kDecrease,kUnipolar,kConcave);
  sf2cute::SFModulator::SFModulator((SFModulator *)&local_528,0);
  sf2cute::SFModulatorItem::SFModulatorItem
            ((SFModulatorItem *)&local_4a0,
             (SFModulator)((uint5)local_520._4_4_ << 0x20 | (uint5)(uint)local_520),
             kInitialAttenuation,0x3c0,
             (SFModulator)((uint5)local_528._4_4_ << 0x20 | (uint5)(uint)local_528),kLinear);
  modulator.key_.amount_source_op_.controller_ = aStack_498._M_local_buf[0];
  modulator.key_.amount_source_op_.controller_palette_ = aStack_498._M_local_buf[1];
  modulator.key_.amount_source_op_.direction_ = aStack_498._M_local_buf[2];
  modulator.key_.amount_source_op_.polarity_ = aStack_498._M_local_buf[3];
  modulator.key_.amount_source_op_.type_ = aStack_498._M_local_buf[4];
  modulator.key_._13_1_ = aStack_498._M_local_buf[5];
  modulator.amount_ = aStack_498._M_allocated_capacity._6_2_;
  modulator.key_._0_8_ = local_4a0;
  modulator._16_2_ = aStack_498._8_2_;
  sf2cute::SFZone::SetModulator(&instrument_zone.super_SFZone,modulator);
  sf2cute::SFInstrumentZone::SFInstrumentZone((SFInstrumentZone *)&ofs,&instrument_zone);
  __l_00._M_len = 1;
  __l_00._M_array = (SFInstrumentZone *)&ofs;
  std::vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>::vector
            (&local_508,__l_00,(allocator_type *)&preset_50);
  sf2cute::SoundFont::
  NewInstrument<std::__cxx11::string_const&,std::vector<sf2cute::SFInstrumentZone,std::allocator<sf2cute::SFInstrumentZone>>>
            ((SoundFont *)&instrument_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf2,
             (vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> *)
             sample_50.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>::~vector
            (&local_508);
  sf2cute::SFInstrumentZone::~SFInstrumentZone((SFInstrumentZone *)&ofs);
  local_514._4_4_ = 0;
  args_1 = (int *)CONCAT44(instrument_50.
                           super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._4_4_,
                           instrument_50.
                           super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._0_4_);
  local_514._0_4_ = 0;
  std::__weak_ptr<sf2cute::SFInstrument,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<sf2cute::SFInstrument,void>
            (local_4b0,
             &instrument_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>);
  sf2cute::SFPresetZone::SFPresetZone
            ((SFPresetZone *)&ofs,(weak_ptr<sf2cute::SFInstrument> *)local_4b0);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&ofs;
  std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::vector
            ((vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)&local_508,
             __l_01,&local_529);
  sf2cute::SoundFont::
  NewPreset<std::__cxx11::string_const&,int,int,std::vector<sf2cute::SFPresetZone,std::allocator<sf2cute::SFPresetZone>>>
            ((SoundFont *)&preset_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf2,args_1,
             (int *)(local_514 + 4),
             (vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)local_514);
  std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::~vector
            ((vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)&local_508);
  sf2cute::SFPresetZone::~SFPresetZone((SFPresetZone *)&ofs);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_4a8);
  std::ofstream::ofstream(&ofs,"output.sf2",_S_bin);
  sf2cute::SoundFont::Write(&sf2,(ostream *)&ofs);
  std::ofstream::~ofstream(&ofs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&preset_50.super___shared_ptr<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&instrument_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sf2cute::SFInstrumentZone::~SFInstrumentZone(&instrument_zone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sample_50.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&data_50.super__Vector_base<short,_std::allocator<short>_>);
  sf2cute::SoundFont::~SoundFont(&sf2);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  SoundFont sf2;

  // Set metadata.
  sf2.set_sound_engine("EMU8000");
  sf2.set_bank_name("Chipsound");
  sf2.set_rom_name("ROM");

  // Construct sample datapoints.
  std::vector<int16_t> data_50 = MakePulseVector(4);

  // Add a sample.
  std::shared_ptr<SFSample> sample_50 = sf2.NewSample(
    "Square",                 // name
    data_50,                  // sample data
    0,                        // start loop
    uint32_t(data_50.size()), // end loop
    44100,                    // sample rate
    57,                       // root key
    0);                       // microtuning

  // Make an instrument zone.
  SFInstrumentZone instrument_zone(sample_50,
    std::vector<SFGeneratorItem>{
      //SFGeneratorItem(SFGenerator::kKeyRange, RangesType(0, 127)),
      //SFGeneratorItem(SFGenerator::kVelRange, RangesType(0, 127)),
      SFGeneratorItem(SFGenerator::kSampleModes, uint16_t(SampleMode::kLoopContinuously)),
    },
    std::vector<SFModulatorItem>{});
  // Add more generators or modulators if necessary.
  instrument_zone.SetGenerator(SFGeneratorItem(SFGenerator::kReverbEffectsSend, 618));
  instrument_zone.SetModulator(SFModulatorItem(
      SFModulator(SFGeneralController::kNoteOnVelocity,
      SFControllerDirection::kDecrease, SFControllerPolarity::kUnipolar,
      SFControllerType::kConcave),
    SFGenerator::kInitialAttenuation,
    960,
    SFModulator(0),
    SFTransform::kLinear));

  // Add an instrument.
  std::shared_ptr<SFInstrument> instrument_50 = sf2.NewInstrument(
    sample_50->name(),
    std::vector<SFInstrumentZone>{
      std::move(instrument_zone)
    });

  // Add a preset.
  std::shared_ptr<SFPreset> preset_50 = sf2.NewPreset(
    instrument_50->name(), 0, 0,
    std::vector<SFPresetZone>{
      SFPresetZone(instrument_50)
    });

  // Print the tree for debugging.
#ifdef SF2CUTE_EXAMPLES_DEBUG_HPP_
  PrintSoundFont(sf2);
#endif

  // Write SoundFont file.
  try {
    std::ofstream ofs("output.sf2", std::ios::binary);
    sf2.Write(ofs);
    return 0;
  }
  catch (const std::fstream::failure & e) {
    // File output error.
    std::cerr << e.what() << std::endl;
    return 1;
  }
  catch (const std::exception & e) {
    // Other errors.
    // For example: Too many samples.
    std::cerr << e.what() << std::endl;
    return 1;
  }
}